

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O3

void av1_find_best_ref_mvs_from_stack
               (int allow_hp,MB_MODE_INFO_EXT *mbmi_ext,MV_REFERENCE_FRAME ref_frame,
               int_mv *nearest_mv,int_mv *near_mv,int is_integer)

{
  short sVar1;
  int_mv iVar2;
  int_mv iVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  MV_REFERENCE_FRAME ref_frames [2];
  MV_REFERENCE_FRAME local_2a [2];
  
  local_2a[1] = 0xff;
  local_2a[0] = ref_frame;
  iVar2 = av1_get_ref_mv_from_stack(0,local_2a,0,mbmi_ext);
  nearest_mv->as_mv = (MV)iVar2;
  uVar4 = iVar2.as_mv.col;
  sVar1 = iVar2.as_mv.row;
  if (is_integer == 0) {
    if (allow_hp != 0) {
      iVar2 = av1_get_ref_mv_from_stack(0,local_2a,1,mbmi_ext);
      *near_mv = iVar2;
      return;
    }
    if ((iVar2.as_int & 1) != 0) {
      (nearest_mv->as_mv).row = sVar1 + (ushort)(sVar1 < 1) * 2 + -1;
    }
    if ((iVar2.as_int >> 0x10 & 1) != 0) {
      (nearest_mv->as_mv).col = uVar4 + (ushort)((short)uVar4 < 1) * 2 + -1;
    }
    iVar2 = av1_get_ref_mv_from_stack(0,local_2a,1,mbmi_ext);
    near_mv->as_mv = (MV)iVar2;
    if ((iVar2.as_int & 1) != 0) {
      (near_mv->as_mv).row = iVar2.as_mv.row + (ushort)(iVar2.as_mv.row < 1) * 2 + -1;
    }
    if ((iVar2.as_int >> 0x10 & 1) == 0) {
      return;
    }
    sVar1 = iVar2.as_mv.col + (ushort)(iVar2.as_mv.col < 1) * 2 + -1;
  }
  else {
    iVar3.as_int = iVar2.as_int + 7;
    if (-1 < sVar1) {
      iVar3 = iVar2;
    }
    uVar5 = sVar1 - (iVar3.as_mv.row & 0xfff8U);
    if (uVar5 != 0) {
      (nearest_mv->as_mv).row = sVar1 - uVar5;
      uVar6 = -uVar5;
      if (0 < (short)uVar5) {
        uVar6 = uVar5;
      }
      if (4 < uVar6) {
        (nearest_mv->as_mv).row = (sVar1 - uVar5) + (ushort)(0 < (short)uVar5) * 0x10 + -8;
      }
    }
    uVar5 = uVar4 + 7;
    if (-1 < (int)iVar2.as_int) {
      uVar5 = uVar4;
    }
    uVar5 = uVar4 - (uVar5 & 0xfff8);
    if (uVar5 != 0) {
      (nearest_mv->as_mv).col = uVar4 - uVar5;
      uVar6 = -uVar5;
      if (0 < (short)uVar5) {
        uVar6 = uVar5;
      }
      if (4 < uVar6) {
        (nearest_mv->as_mv).col = (ushort)(0 < (short)uVar5) * 0x10 + (uVar4 - uVar5) + -8;
      }
    }
    iVar3 = av1_get_ref_mv_from_stack(0,local_2a,1,mbmi_ext);
    near_mv->as_mv = (MV)iVar3;
    sVar1 = iVar3.as_mv.row;
    iVar2.as_int = iVar3.as_int + 7;
    if (-1 < sVar1) {
      iVar2 = iVar3;
    }
    uVar4 = iVar3.as_mv.col;
    uVar5 = sVar1 - (iVar2.as_mv.row & 0xfff8U);
    if (uVar5 != 0) {
      (near_mv->as_mv).row = sVar1 - uVar5;
      uVar6 = -uVar5;
      if (0 < (short)uVar5) {
        uVar6 = uVar5;
      }
      if (4 < uVar6) {
        (near_mv->as_mv).row = (sVar1 - uVar5) + (ushort)(0 < (short)uVar5) * 0x10 + -8;
      }
    }
    uVar5 = uVar4 + 7;
    if (-1 < (int)iVar3.as_int) {
      uVar5 = uVar4;
    }
    uVar5 = uVar4 - (uVar5 & 0xfff8);
    if (uVar5 == 0) {
      return;
    }
    (near_mv->as_mv).col = uVar4 - uVar5;
    uVar6 = -uVar5;
    if (0 < (short)uVar5) {
      uVar6 = uVar5;
    }
    if (uVar6 < 5) {
      return;
    }
    sVar1 = (ushort)(0 < (short)uVar5) * 0x10 + (uVar4 - uVar5) + -8;
  }
  (near_mv->as_mv).col = sVar1;
  return;
}

Assistant:

void av1_find_best_ref_mvs_from_stack(int allow_hp,
                                      const MB_MODE_INFO_EXT *mbmi_ext,
                                      MV_REFERENCE_FRAME ref_frame,
                                      int_mv *nearest_mv, int_mv *near_mv,
                                      int is_integer) {
  const int ref_idx = 0;
  MV_REFERENCE_FRAME ref_frames[2] = { ref_frame, NONE_FRAME };
  *nearest_mv = av1_get_ref_mv_from_stack(ref_idx, ref_frames, 0, mbmi_ext);
  lower_mv_precision(&nearest_mv->as_mv, allow_hp, is_integer);
  *near_mv = av1_get_ref_mv_from_stack(ref_idx, ref_frames, 1, mbmi_ext);
  lower_mv_precision(&near_mv->as_mv, allow_hp, is_integer);
}